

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  size_t *psVar1;
  ZSTD_CCtx_params *__dest;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  XXH64_hash_t XVar5;
  int iVar6;
  ZSTD_CDict *pZVar7;
  ZSTDMT_jobDescription *pZVar8;
  xxh_u64 xVar9;
  size_t sVar10;
  undefined2 *puVar11;
  uint uVar12;
  ZSTD_EndDirective ZVar13;
  uint uVar14;
  ZSTDMT_jobDescription *pZVar15;
  BYTE *rangeStart;
  long lVar16;
  BYTE *pBVar17;
  uint uVar18;
  BYTE *bufferStart;
  void *pvVar19;
  ZSTDMT_jobDescription *pZVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  byte *pbVar24;
  ulong uVar25;
  BYTE *bufferStart_1;
  size_t __n;
  BYTE *pBVar26;
  size_t pos_1;
  ulong uVar27;
  BYTE *istart;
  ulong uVar28;
  BYTE *pBVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  buffer_t buffer;
  buffer_t buf;
  buffer_t bVar32;
  
  if (output->size < output->pos) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf4,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  uVar28 = input->size;
  uVar21 = input->pos;
  if (uVar28 < uVar21) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf5,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if ((endOp == ZSTD_e_continue) && (mtctx->frameEnded != 0)) {
    return 0xffffffffffffffc4;
  }
  bVar30 = false;
  if ((uVar21 < uVar28) && (mtctx->jobReady == 0)) {
    pBVar26 = (BYTE *)(mtctx->inBuff).buffer.start;
    if (pBVar26 == (BYTE *)0x0) {
      if ((mtctx->inBuff).filled != 0) {
        __assert_fail("mtctx->inBuff.filled == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8c00,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      uVar18 = mtctx->doneJobID;
      uVar14 = mtctx->nextJobID;
      pBVar17 = (BYTE *)0x0;
      uVar28 = 0;
      if (uVar18 < uVar14) {
        pZVar15 = mtctx->jobs;
        do {
          uVar12 = mtctx->jobIDMask & uVar18;
          pthread_mutex_lock((pthread_mutex_t *)&pZVar15[uVar12].job_mutex);
          uVar21 = mtctx->jobs[uVar12].consumed;
          pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar12].job_mutex);
          pZVar15 = mtctx->jobs;
          uVar28 = pZVar15[uVar12].src.size;
          if (uVar21 < uVar28) {
            uVar21 = pZVar15[uVar12].prefix.size;
            if (uVar21 != 0) {
              uVar28 = uVar21;
            }
            pBVar17 = (BYTE *)(&pZVar15[uVar12].prefix)[uVar21 == 0].start;
            if (pZVar15[uVar12].src.start < pBVar17) {
              __assert_fail("range.start <= mtctx->jobs[wJobID].src.start",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8af4,"range_t ZSTDMT_getInputDataInUse(ZSTDMT_CCtx *)");
            }
            goto LAB_0016d3e9;
          }
          uVar18 = uVar18 + 1;
        } while (uVar14 != uVar18);
        uVar28 = 0;
        pBVar17 = (BYTE *)0x0;
      }
LAB_0016d3e9:
      if ((mtctx->inBuff).buffer.start != (void *)0x0) {
        __assert_fail("mtctx->inBuff.buffer.start == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8b47,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
      }
      uVar21 = mtctx->targetSectionSize;
      uVar4 = (mtctx->roundBuff).capacity;
      if (uVar4 < uVar21) {
        __assert_fail("mtctx->roundBuff.capacity >= target",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8b48,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
      }
      __n = (mtctx->roundBuff).pos;
      if (uVar4 - __n < uVar21) {
        __n = (mtctx->inBuff).prefix.size;
        pBVar26 = (mtctx->roundBuff).buffer;
        if ((((pBVar26 == (BYTE *)0x0 || pBVar17 == (BYTE *)0x0) || (uVar28 == 0)) || (__n == 0)) ||
           ((pBVar17 + uVar28 <= pBVar26 || (pBVar26 + __n <= pBVar17)))) {
          bVar32.capacity = __n;
          bVar32.start = pBVar26;
          ZSTDMT_waitForLdmComplete(mtctx,bVar32);
          memmove(pBVar26,(mtctx->inBuff).prefix.start,__n);
          (mtctx->inBuff).prefix.start = pBVar26;
          (mtctx->roundBuff).pos = __n;
          goto LAB_0016d46d;
        }
LAB_0016d596:
        if (mtctx->doneJobID == mtctx->nextJobID) {
          __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8c06,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        pBVar26 = (BYTE *)(mtctx->inBuff).buffer.start;
      }
      else {
LAB_0016d46d:
        pBVar29 = (mtctx->roundBuff).buffer;
        pBVar26 = pBVar29 + __n;
        if (((pBVar29 != (BYTE *)0x0 && pBVar17 != (BYTE *)0x0) && (uVar28 != 0)) &&
           ((uVar21 != 0 && ((pBVar26 < pBVar17 + uVar28 && (pBVar17 < pBVar26 + uVar21))))))
        goto LAB_0016d596;
        pBVar17 = (BYTE *)(mtctx->inBuff).prefix.start;
        if ((pBVar17 != (BYTE *)0x0 && pBVar29 != (BYTE *)0x0) &&
           (sVar10 = (mtctx->inBuff).prefix.size,
           (pBVar26 < pBVar17 + sVar10 && (sVar10 != 0 && uVar21 != 0)) &&
           pBVar17 < pBVar26 + uVar21)) {
          __assert_fail("!ZSTDMT_isOverlapped(buffer, mtctx->inBuff.prefix)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8b63,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
        }
        buffer.capacity = uVar21;
        buffer.start = pBVar26;
        ZSTDMT_waitForLdmComplete(mtctx,buffer);
        (mtctx->inBuff).buffer.start = pBVar26;
        (mtctx->inBuff).buffer.capacity = uVar21;
        (mtctx->inBuff).filled = 0;
        if ((mtctx->roundBuff).capacity < uVar21 + (mtctx->roundBuff).pos) {
          __assert_fail("mtctx->roundBuff.pos + buffer.capacity <= mtctx->roundBuff.capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8b71,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
        }
      }
      if (pBVar26 == (BYTE *)0x0) {
        uVar21 = input->pos;
        bVar30 = false;
        goto LAB_0016d6c8;
      }
      uVar28 = input->size;
      uVar21 = input->pos;
    }
    uVar28 = uVar28 - uVar21;
    uVar4 = (mtctx->inBuff).filled;
    pvVar19 = (void *)(uVar21 + (long)input->src);
    uVar21 = mtctx->targetSectionSize - uVar4;
    if (uVar28 < uVar21) {
      uVar21 = uVar28;
    }
    bVar30 = false;
    uVar27 = uVar21;
    if ((((mtctx->params).rsyncable != 0) && (0x1ffff < uVar28 + uVar4)) && (0x1f < uVar21 + uVar4))
    {
      uVar28 = (mtctx->rsync).hitMask;
      if (uVar4 < 0x20000) {
        uVar23 = -uVar4 + 0x20000;
        pBVar29 = (BYTE *)((long)pvVar19 + -uVar4 + 0x1ffe0);
        if (uVar4 < 0x1ffe1) {
          lVar16 = 0;
          uVar22 = 0;
          do {
            uVar22 = uVar22 * -0x30e44323485a9b9d + (ulong)pBVar29[lVar16] + 10;
            lVar16 = lVar16 + 1;
            pBVar17 = pBVar29;
          } while (lVar16 != 0x20);
        }
        else {
          uVar27 = 0x1ffe0;
          uVar22 = 0;
          do {
            uVar22 = uVar22 * -0x30e44323485a9b9d + (ulong)pBVar26[uVar27] + 10;
            uVar27 = uVar27 + 1;
          } while (uVar4 != uVar27);
          uVar27 = 0;
          do {
            uVar22 = uVar22 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar19 + uVar27) + 10;
            uVar27 = uVar27 + 1;
            pBVar17 = pBVar26 + (uVar4 - 0x20);
          } while (uVar23 != uVar27);
        }
        if (uVar4 < 0x1ffe1) {
          lVar16 = 0;
          uVar27 = 0;
          do {
            uVar27 = uVar27 * -0x30e44323485a9b9d + (ulong)pBVar29[lVar16] + 10;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x20);
          if (uVar27 != uVar22) {
            __assert_fail("pos < RSYNC_LENGTH || ZSTD_rollingHash_compute(istart + pos - RSYNC_LENGTH, RSYNC_LENGTH) == hash"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8bcc,
                          "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                         );
          }
        }
      }
      else {
        pBVar17 = pBVar26 + (uVar4 - 0x20);
        lVar16 = -0x20;
        uVar22 = 0;
        do {
          uVar22 = uVar22 * -0x30e44323485a9b9d + (ulong)pBVar26[lVar16 + uVar4] + 10;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
        bVar30 = true;
        uVar23 = 0;
        uVar27 = 0;
        if ((uVar28 & ~uVar22) == 0) goto LAB_0016d679;
      }
      uVar25 = uVar23;
      bVar30 = false;
      if (uVar23 < uVar21) {
        do {
          uVar27 = uVar23 + 1;
          pbVar24 = (byte *)((long)pvVar19 + (uVar23 - 0x20));
          if (uVar23 < 0x20) {
            pbVar24 = pBVar17 + uVar23;
          }
          if ((uVar4 + uVar27) - 1 < 0x20000) {
            __assert_fail("mtctx->inBuff.filled + pos >= RSYNC_MIN_BLOCK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8bd5,
                          "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                         );
          }
          uVar22 = (uVar22 - ((ulong)*pbVar24 + 10) * (mtctx->rsync).primePower) *
                   -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar19 + uVar23) + 10;
          if ((uVar28 & ~uVar22) == 0) {
            uVar25 = uVar27;
            uVar21 = uVar27;
            bVar30 = true;
            break;
          }
          uVar25 = uVar21;
          uVar23 = uVar27;
          bVar30 = false;
        } while (uVar27 != uVar21);
      }
      uVar27 = uVar21;
      if (0x1f < uVar25) {
        lVar16 = -0x20;
        uVar28 = 0;
        do {
          uVar28 = uVar28 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar19 + lVar16 + uVar25)
                   + 10;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
        if (uVar28 != uVar22) {
          __assert_fail("pos < RSYNC_LENGTH || ZSTD_rollingHash_compute(istart + pos - RSYNC_LENGTH, RSYNC_LENGTH) == hash"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8bdd,
                        "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                       );
        }
      }
    }
LAB_0016d679:
    if ((mtctx->inBuff).buffer.capacity < mtctx->targetSectionSize) {
      __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c0f,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    ZVar13 = ZSTD_e_flush;
    if (!bVar30) {
      ZVar13 = endOp;
    }
    if (endOp == ZSTD_e_continue) {
      endOp = ZVar13;
    }
    memcpy(pBVar26 + uVar4,pvVar19,uVar27);
    uVar21 = input->pos + uVar27;
    input->pos = uVar21;
    psVar1 = &(mtctx->inBuff).filled;
    *psVar1 = *psVar1 + uVar27;
    bVar30 = uVar27 != 0;
  }
LAB_0016d6c8:
  if ((endOp == ZSTD_e_end) && (uVar21 < input->size)) {
    sVar10 = (mtctx->inBuff).filled;
    endOp = ZSTD_e_flush;
    if ((sVar10 != 0) && ((sVar10 != mtctx->targetSectionSize && ((mtctx->params).rsyncable == 0))))
    {
      __assert_fail("mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c1f,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
  }
  uVar28 = (mtctx->inBuff).filled;
  if (((mtctx->targetSectionSize <= uVar28 || mtctx->jobReady != 0) ||
      (endOp != ZSTD_e_continue && uVar28 != 0)) ||
     ((endOp == ZSTD_e_end && (mtctx->frameEnded == 0)))) {
    if (mtctx->targetSectionSize < uVar28) {
      __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c28,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    uVar18 = mtctx->jobIDMask;
    uVar14 = uVar18 & mtctx->nextJobID;
    if (mtctx->doneJobID + uVar18 < mtctx->nextJobID) {
      if (uVar14 != (mtctx->doneJobID & uVar18)) {
        __assert_fail("(mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8a36,
                      "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                     );
      }
    }
    else {
      if (mtctx->jobReady == 0) {
        pZVar15 = mtctx->jobs;
        pvVar19 = (mtctx->inBuff).buffer.start;
        pZVar15[uVar14].src.start = pvVar19;
        pZVar15[uVar14].src.size = uVar28;
        sVar10 = (mtctx->inBuff).prefix.size;
        pZVar15[uVar14].prefix.start = (mtctx->inBuff).prefix.start;
        pZVar15[uVar14].prefix.size = sVar10;
        __dest = &mtctx->jobs[uVar14].params;
        *(undefined8 *)((long)(__dest + -1) + 8) = 0;
        *(undefined8 *)((long)(__dest + -1) + 0x10) = 0;
        memcpy(__dest,&mtctx->params,0xd0);
        if (mtctx->nextJobID == 0) {
          pZVar7 = mtctx->cdict;
        }
        else {
          pZVar7 = (ZSTD_CDict *)0x0;
        }
        pZVar15 = mtctx->jobs;
        pZVar15[uVar14].cdict = pZVar7;
        pZVar15[uVar14].fullFrameSize = mtctx->frameContentSize;
        pZVar15[uVar14].dstBuff.start = (void *)0x0;
        pZVar15[uVar14].dstBuff.capacity = 0;
        pZVar15 = mtctx->jobs;
        uVar2 = mtctx->bufPool;
        uVar3 = mtctx->cctxPool;
        auVar31._8_4_ = (int)uVar2;
        auVar31._0_8_ = uVar3;
        auVar31._12_4_ = (int)((ulong)uVar2 >> 0x20);
        pZVar15[uVar14].cctxPool = (ZSTDMT_CCtxPool *)uVar3;
        pZVar15[uVar14].bufPool = (ZSTDMT_bufferPool *)auVar31._8_8_;
        pZVar15[uVar14].seqPool = mtctx->seqPool;
        pZVar15[uVar14].serial = &mtctx->serial;
        uVar18 = mtctx->nextJobID;
        pZVar15[uVar14].jobID = uVar18;
        pZVar15[uVar14].firstJob = (uint)(uVar18 == 0);
        pZVar15[uVar14].lastJob = (uint)(endOp == ZSTD_e_end);
        pZVar15[uVar14].frameChecksumNeeded =
             (uint)(((mtctx->params).fParams.checksumFlag != 0 && uVar18 != 0) &&
                   endOp == ZSTD_e_end);
        pZVar15[uVar14].dstFlushed = 0;
        psVar1 = &(mtctx->roundBuff).pos;
        *psVar1 = *psVar1 + uVar28;
        (mtctx->inBuff).filled = 0;
        (mtctx->inBuff).buffer.start = (void *)0x0;
        (mtctx->inBuff).buffer.capacity = 0;
        if (endOp == ZSTD_e_end) {
          (mtctx->inBuff).prefix.start = (void *)0x0;
          (mtctx->inBuff).prefix.size = 0;
          mtctx->frameEnded = (uint)(endOp == ZSTD_e_end);
          if (uVar18 == 0) {
            (mtctx->params).fParams.checksumFlag = 0;
          }
          else if (uVar28 == 0) {
            if (pZVar15[uVar14].lastJob != 1) {
              __assert_fail("job->lastJob == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a1f,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            pZVar15 = pZVar15 + uVar14;
            if ((pZVar15->src).size != 0) {
              __assert_fail("job->src.size == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a20,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            if (pZVar15->firstJob != 0) {
              __assert_fail("job->firstJob == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a21,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            if ((pZVar15->dstBuff).start != (void *)0x0) {
              __assert_fail("job->dstBuff.start == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a22,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            bVar32 = ZSTDMT_getBuffer(pZVar15->bufPool);
            puVar11 = (undefined2 *)bVar32.start;
            pZVar15->dstBuff = bVar32;
            if (puVar11 == (undefined2 *)0x0) {
              pZVar15->cSize = 0xffffffffffffffc0;
            }
            else {
              if (bVar32.capacity < 3) {
                __assert_fail("job->dstBuff.capacity >= ZSTD_blockHeaderSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x8a28,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
              }
              (pZVar15->src).start = (void *)0x0;
              (pZVar15->src).size = 0;
              *puVar11 = 1;
              *(undefined1 *)(puVar11 + 1) = 0;
              pZVar15->cSize = 3;
              if (pZVar15->consumed != 0) {
                __assert_fail("job->consumed == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x8a2c,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
              }
            }
            mtctx->nextJobID = mtctx->nextJobID + 1;
            goto LAB_0016db75;
          }
        }
        else {
          uVar21 = mtctx->targetPrefixSize;
          if (uVar28 <= mtctx->targetPrefixSize) {
            uVar21 = uVar28;
          }
          (mtctx->inBuff).prefix.start = (void *)((long)pvVar19 + (uVar28 - uVar21));
          (mtctx->inBuff).prefix.size = uVar21;
          if (uVar28 == 0 && uVar18 != 0) {
            __assert_fail("endOp == ZSTD_e_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8a66,
                          "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                         );
          }
        }
      }
      else {
        pZVar15 = mtctx->jobs;
      }
      iVar6 = POOL_tryAdd(mtctx->factory,ZSTDMT_compressionJob,pZVar15 + uVar14);
      if (iVar6 != 0) {
        mtctx->nextJobID = mtctx->nextJobID + 1;
      }
      mtctx->jobReady = (uint)(iVar6 == 0);
    }
  }
LAB_0016db75:
  if (output->size < output->pos) {
    __assert_fail("output->size >= output->pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8a89,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  uVar18 = mtctx->jobIDMask & mtctx->doneJobID;
  pZVar15 = mtctx->jobs;
  pthread_mutex_lock((pthread_mutex_t *)&pZVar15[uVar18].job_mutex);
  if (bVar30) {
    pZVar8 = mtctx->jobs;
  }
  else {
    pZVar15 = (ZSTDMT_jobDescription *)(ulong)mtctx->doneJobID;
    pZVar8 = mtctx->jobs;
    if (mtctx->doneJobID < mtctx->nextJobID) {
      pZVar15 = (ZSTDMT_jobDescription *)pZVar8[uVar18].cSize;
      if (pZVar15 < (ZSTDMT_jobDescription *)pZVar8[uVar18].dstFlushed) {
        __assert_fail("mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8a8e,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if ((ZSTDMT_jobDescription *)pZVar8[uVar18].dstFlushed == pZVar15) {
        do {
          pZVar20 = pZVar8 + uVar18;
          pZVar15 = (ZSTDMT_jobDescription *)pZVar20->consumed;
          if (pZVar15 == (ZSTDMT_jobDescription *)(pZVar20->src).size) break;
          pthread_cond_wait((pthread_cond_t *)&pZVar20->job_cond,
                            (pthread_mutex_t *)&pZVar20->job_mutex);
          pZVar8 = mtctx->jobs;
          pZVar15 = (ZSTDMT_jobDescription *)pZVar8[uVar18].dstFlushed;
        } while (pZVar15 == (ZSTDMT_jobDescription *)pZVar8[uVar18].cSize);
      }
    }
  }
  pZVar8 = pZVar8 + uVar18;
  uVar28 = pZVar8->consumed;
  uVar21 = pZVar8->cSize;
  uVar4 = (pZVar8->src).size;
  pthread_mutex_unlock((pthread_mutex_t *)&pZVar8->job_mutex);
  if (0xffffffffffffff88 < uVar21) {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
    goto LAB_0016df06;
  }
  if (uVar4 < uVar28) {
    __assert_fail("srcConsumed <= srcSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8aa7,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  pZVar8 = mtctx->jobs;
  if ((uVar28 == uVar4) && (pZVar8[uVar18].frameChecksumNeeded != 0)) {
    uVar27 = (mtctx->serial).xxhState.total_len;
    if (uVar27 < 0x20) {
      lVar16 = (mtctx->serial).xxhState.v[2] + 0x27d4eb2f165667c5;
    }
    else {
      XVar5 = (mtctx->serial).xxhState.v[0];
      uVar22 = (mtctx->serial).xxhState.v[1];
      uVar23 = (mtctx->serial).xxhState.v[2];
      uVar25 = (mtctx->serial).xxhState.v[3];
      pZVar15 = (ZSTDMT_jobDescription *)
                (((uVar22 * -0x6c158a5880000000 | uVar22 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 ((XVar5 * -0x6c158a5880000000 | XVar5 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 (uVar25 << 0x12 | uVar25 >> 0x2e) + (uVar23 << 0xc | uVar23 >> 0x34) +
                 (uVar22 << 7 | uVar22 >> 0x39) + (XVar5 << 1 | (ulong)((long)XVar5 < 0))) *
                 -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                0x85ebca77c2b2ae63);
      lVar16 = ((uVar25 * -0x6c158a5880000000 | uVar25 * -0x3d4d51c2d82b14b1 >> 0x21) *
                -0x61c8864e7a143579 ^
               ((uVar23 * -0x6c158a5880000000 | uVar23 * -0x3d4d51c2d82b14b1 >> 0x21) *
                -0x61c8864e7a143579 ^ (ulong)pZVar15) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
               -0x61c8864e7a143579 + -0x7a1435883d4d519d;
    }
    xVar9 = XXH64_finalize(lVar16 + uVar27,(xxh_u8 *)(mtctx->serial).xxhState.mem64,uVar27,
                           (XXH_alignment)pZVar15);
    sVar10 = pZVar8[uVar18].cSize;
    *(int *)((long)pZVar8[uVar18].dstBuff.start + sVar10) = (int)xVar9;
    uVar21 = uVar21 + 4;
    pZVar8[uVar18].cSize = sVar10 + 4;
    pZVar8[uVar18].frameChecksumNeeded = 0;
LAB_0016dddf:
    uVar27 = pZVar8[uVar18].dstFlushed;
    sVar10 = output->pos;
    uVar22 = output->size - sVar10;
    if (uVar21 - uVar27 < uVar22) {
      uVar22 = uVar21 - uVar27;
    }
    if (mtctx->nextJobID <= mtctx->doneJobID) {
      __assert_fail("mtctx->doneJobID < mtctx->nextJobID",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8ab6,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if (uVar21 < uVar27) {
      __assert_fail("cSize >= mtctx->jobs[wJobID].dstFlushed",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8ab7,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    pvVar19 = pZVar8[uVar18].dstBuff.start;
    if (pvVar19 == (void *)0x0) {
      __assert_fail("mtctx->jobs[wJobID].dstBuff.start != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8ab8,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if (uVar22 != 0) {
      memcpy((void *)(sVar10 + (long)output->dst),(void *)((long)pvVar19 + uVar27),uVar22);
      sVar10 = output->pos;
      pZVar8 = mtctx->jobs;
      uVar27 = pZVar8[uVar18].dstFlushed;
    }
    uVar27 = uVar27 + uVar22;
    output->pos = sVar10 + uVar22;
    pZVar8[uVar18].dstFlushed = uVar27;
    if ((uVar28 == uVar4) && (uVar27 == uVar21)) {
      buf.capacity = pZVar8[uVar18].dstBuff.capacity;
      buf.start = pZVar8[uVar18].dstBuff.start;
      ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
      pZVar15 = mtctx->jobs;
      pZVar15[uVar18].dstBuff.start = (void *)0x0;
      pZVar15[uVar18].dstBuff.capacity = 0;
      pZVar15 = mtctx->jobs;
      pZVar15[uVar18].cSize = 0;
      mtctx->consumed = mtctx->consumed + uVar28;
      mtctx->produced = mtctx->produced + uVar21;
      mtctx->doneJobID = mtctx->doneJobID + 1;
      uVar27 = pZVar15[uVar18].dstFlushed;
    }
    bVar30 = uVar27 <= uVar21;
    uVar21 = uVar21 - uVar27;
    if (bVar30 && uVar21 != 0) goto LAB_0016df06;
  }
  else if (uVar21 != 0) goto LAB_0016dddf;
  uVar21 = 1;
  if ((((uVar4 <= uVar28) && (mtctx->nextJobID <= mtctx->doneJobID)) && (mtctx->jobReady == 0)) &&
     ((mtctx->inBuff).filled == 0)) {
    mtctx->allJobsCompleted = mtctx->frameEnded;
    uVar21 = 0;
    if (endOp == ZSTD_e_end) {
      uVar21 = (ulong)(mtctx->frameEnded == 0);
    }
  }
LAB_0016df06:
  sVar10 = uVar21 + (uVar21 == 0);
  if (input->size <= input->pos) {
    sVar10 = uVar21;
  }
  return sVar10;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            ZSTD_memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
    }
    if ((input->pos < input->size) && (endOp == ZSTD_e_end)) {
        /* Can't end yet because the input is not fully consumed.
            * We are in one of these cases:
            * - mtctx->inBuff is NULL & empty: we couldn't get an input buffer so don't create a new job.
            * - We filled the input buffer: flush this job but don't end the frame.
            * - We hit a synchronization point: flush this job but don't end the frame.
            */
        assert(mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable);
        endOp = ZSTD_e_flush;
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) , "");
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}